

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5SorterNext(Fts5Cursor *pCsr)

{
  int iVar1;
  sqlite3_int64 sVar2;
  u32 local_40;
  int local_3c;
  int iVal;
  int iOff;
  int i;
  int nBlob;
  u8 *aBlob;
  u8 *a;
  Fts5Sorter *pFStack_18;
  int rc;
  Fts5Sorter *pSorter;
  Fts5Cursor *pCsr_local;
  
  pFStack_18 = pCsr->pSorter;
  pSorter = (Fts5Sorter *)pCsr;
  a._4_4_ = sqlite3_step(pFStack_18->pStmt);
  if (a._4_4_ == 0x65) {
    a._4_4_ = 0;
    *(uint *)&pSorter[2].aPoslist = *(uint *)&pSorter[2].aPoslist | 1;
  }
  else if (a._4_4_ == 100) {
    local_3c = 0;
    a._4_4_ = 0;
    sVar2 = sqlite3_column_int64(pFStack_18->pStmt,0);
    pFStack_18->iRowid = sVar2;
    iOff = sqlite3_column_bytes(pFStack_18->pStmt,1);
    _i = (u8 *)sqlite3_column_blob(pFStack_18->pStmt,1);
    aBlob = _i;
    if (0 < iOff) {
      for (iVal = 0; iVal < pFStack_18->nIdx + -1; iVal = iVal + 1) {
        iVar1 = sqlite3Fts5GetVarint32(aBlob,&local_40);
        aBlob = aBlob + iVar1;
        local_3c = local_40 + local_3c;
        pFStack_18->aIdx[iVal] = local_3c;
      }
      pFStack_18->aIdx[iVal] = ((int)_i + iOff) - (int)aBlob;
      pFStack_18->aPoslist = aBlob;
    }
    fts5CsrNewrow((Fts5Cursor *)pSorter);
  }
  return a._4_4_;
}

Assistant:

static int fts5SorterNext(Fts5Cursor *pCsr){
  Fts5Sorter *pSorter = pCsr->pSorter;
  int rc;

  rc = sqlite3_step(pSorter->pStmt);
  if( rc==SQLITE_DONE ){
    rc = SQLITE_OK;
    CsrFlagSet(pCsr, FTS5CSR_EOF);
  }else if( rc==SQLITE_ROW ){
    const u8 *a;
    const u8 *aBlob;
    int nBlob;
    int i;
    int iOff = 0;
    rc = SQLITE_OK;

    pSorter->iRowid = sqlite3_column_int64(pSorter->pStmt, 0);
    nBlob = sqlite3_column_bytes(pSorter->pStmt, 1);
    aBlob = a = sqlite3_column_blob(pSorter->pStmt, 1);

    /* nBlob==0 in detail=none mode. */
    if( nBlob>0 ){
      for(i=0; i<(pSorter->nIdx-1); i++){
        int iVal;
        a += fts5GetVarint32(a, iVal);
        iOff += iVal;
        pSorter->aIdx[i] = iOff;
      }
      pSorter->aIdx[i] = &aBlob[nBlob] - a;
      pSorter->aPoslist = a;
    }

    fts5CsrNewrow(pCsr);
  }

  return rc;
}